

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

double __thiscall soplex::SPxMainSM<double>::opttol(SPxMainSM<double> *this)

{
  element_type *this_00;
  Real RVar1;
  
  SPxSimplifier<double>::tolerances((SPxSimplifier<double> *)&stack0xffffffffffffffe8);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2c8dd5);
  RVar1 = Tolerances::floatingPointOpttol(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2c8def);
  return RVar1;
}

Assistant:

R opttol() const
   {
      return this->tolerances()->floatingPointOpttol();
   }